

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::EmitSeizedForBugreportLifecycleEvent
          (TracingServiceImpl *this,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  size_t packets_00;
  TracePacket *pTVar1;
  uint64_t value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  Message *local_f8;
  TracingServiceEvent *service_event;
  undefined1 local_d8 [8];
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets_local;
  TracingServiceImpl *this_local;
  
  packet.msg_.root_arena_.blocks_.
  super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>.
  _M_impl._M_node._M_size = (size_t)packets;
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered
            ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_d8);
  pTVar1 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                     ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_d8);
  service_event = (TracingServiceEvent *)perfetto::base::GetBootTimeNs();
  value = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&service_event);
  protos::pbzero::TracePacket::set_timestamp(pTVar1,value);
  pTVar1 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                     ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_d8);
  protos::pbzero::TracePacket::set_trusted_uid(pTVar1,this->uid_);
  pTVar1 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                     ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_d8);
  protos::pbzero::TracePacket::set_trusted_packet_sequence_id(pTVar1,1);
  pTVar1 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                     ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_d8);
  local_f8 = &protos::pbzero::TracePacket::
              set_service_event<perfetto::protos::pbzero::TracingServiceEvent>(pTVar1)->
              super_Message;
  protozero::Message::AppendVarInt<int>(local_f8,6,1);
  packets_00 = packet.msg_.root_arena_.blocks_.
               super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
               ._M_impl._M_node._M_size;
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::SerializeAsArray
            (&local_110,(HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_d8);
  anon_unknown_4::SerializeAndAppendPacket
            ((vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)packets_00,
             &local_110);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_110);
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::~HeapBuffered
            ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_d8);
  return;
}

Assistant:

void TracingServiceImpl::EmitSeizedForBugreportLifecycleEvent(
    std::vector<TracePacket>* packets) {
  protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
  packet->set_timestamp(static_cast<uint64_t>(base::GetBootTimeNs().count()));
  packet->set_trusted_uid(static_cast<int32_t>(uid_));
  packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
  auto* service_event = packet->set_service_event();
  service_event->AppendVarInt(
      protos::pbzero::TracingServiceEvent::kSeizedForBugreportFieldNumber, 1);
  SerializeAndAppendPacket(packets, packet.SerializeAsArray());
}